

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Mesh::setSelection(Mesh *this,int pickID,Selection *selection)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppHVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int local_c;
  
  p_Var3 = (this->idToElement)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->idToElement)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (pickID <= (int)p_Var3[1]._M_color) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < pickID];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((int)p_Var4[1]._M_color <= pickID)) {
      (selection->coordinates).y = 0.0;
      (selection->coordinates).z = 0.0;
      selection->element = (HalfedgeElement *)0x0;
      (selection->coordinates).x = 0.0;
      selection->axis = None;
      selection->object = &this->super_SceneObject;
      local_c = pickID;
      ppHVar2 = std::
                map<int,_CS248::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::HalfedgeElement_*>_>_>
                ::operator[](&this->idToElement,&local_c);
      selection->element = *ppHVar2;
    }
  }
  return;
}

Assistant:

void Mesh::setSelection(int pickID, Selection &selection) {
  // Set the selection to the element specified by the given picking ID;
  // these values were generated in Mesh::draw_pick.
  if (idToElement.find(pickID) != idToElement.end()) {
    selection.clear();
    selection.object = this;
    selection.element = idToElement[pickID];
  }
}